

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O0

void __thiscall
CyclicHash<unsigned_int,_unsigned_char>::CyclicHash
          (CyclicHash<unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  uint uVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  int mywordsize_local;
  int myn_local;
  CyclicHash<unsigned_int,_unsigned_char> *this_local;
  
  this->hashvalue = 0;
  this->n = myn;
  this->wordsize = mywordsize;
  uVar1 = maskfnc<unsigned_int>(this->wordsize);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,uVar1);
  uVar1 = maskfnc<unsigned_int>(this->wordsize + -1);
  this->mask1 = uVar1;
  this->myr = this->n % this->wordsize;
  uVar1 = maskfnc<unsigned_int>(this->wordsize - this->myr);
  this->maskn = uVar1;
  if (0x20 < (uint)this->wordsize) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Can\'t create ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->wordsize);
    poVar2 = std::operator<<(poVar2,"-bit hash values");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "abord";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  return;
}

Assistant:

CyclicHash(int myn, int mywordsize = 19)
      : hashvalue(0), n(myn), wordsize(mywordsize),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        mask1(maskfnc<hashvaluetype>(wordsize - 1)), myr(n % wordsize),
        maskn(maskfnc<hashvaluetype>(wordsize - myr)) {
    if (static_cast<uint>(wordsize) > 8 * sizeof(hashvaluetype)) {
      cerr << "Can't create " << wordsize << "-bit hash values" << endl;
      throw "abord";
    }
  }